

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O2

void instantiate_children
               (ecs_world_t *world,ecs_entity_t base,ecs_table_t *table,ecs_data_t *data,int32_t row
               ,int32_t count,ecs_table_t *child_table)

{
  short sVar1;
  ecs_vector_t *peVar2;
  ecs_type_t peVar3;
  ecs_column_t *peVar4;
  ecs_entity_t base_00;
  undefined8 uVar5;
  undefined8 uVar6;
  ecs_world_t *peVar7;
  int32_t iVar8;
  uint uVar9;
  void *pvVar10;
  ecs_table_t *peVar11;
  ecs_data_t *peVar12;
  short offset;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ecs_entities_t *component_ids;
  long lVar16;
  int32_t *row_out;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ecs_entity_t *peVar21;
  ulong uStack_b0;
  ecs_entity_t eStack_a8;
  ecs_entities_t local_a0;
  ecs_table_t *local_90;
  long local_88;
  int local_7c;
  int32_t local_78;
  int32_t child_row;
  ecs_world_t *local_70;
  ulong local_68;
  ecs_data_t *local_60;
  long local_58;
  ecs_entity_t *local_50;
  ulong local_48;
  ecs_data_t *local_40;
  ecs_table_t *local_38;
  
  peVar2 = child_table->type;
  uStack_b0 = 0x111849;
  local_90 = table;
  local_70 = world;
  local_68 = base;
  local_40 = data;
  local_60 = ecs_table_get_data(child_table);
  if (local_60 != (ecs_data_t *)0x0) {
    uStack_b0 = 0x11185d;
    iVar8 = ecs_table_data_count(local_60);
    if (iVar8 != 0) {
      iVar18 = child_table->column_count;
      uStack_b0 = 0x111883;
      local_78 = count;
      child_row = row;
      local_38 = (ecs_table_t *)_ecs_vector_first(peVar2,8,0x10);
      uStack_b0 = 0x11188f;
      uVar9 = ecs_vector_count(peVar2);
      peVar21 = (ecs_entity_t *)
                ((long)&eStack_a8 - ((long)(int)(uVar9 * 8 + 1) + 0xfU & 0xfffffffffffffff0));
      local_a0.array = peVar21;
      local_58 = (long)iVar18;
      lVar13 = (long)peVar21 - ((long)iVar18 * 8 + 0xfU & 0xfffffffffffffff0);
      local_88 = lVar13;
      uVar17 = 0;
      uVar20 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar20 = uVar17;
      }
      *(undefined8 *)(lVar13 + -8) = 0xffffffffffffffff;
      uVar15 = *(ulong *)(lVar13 + -8);
      *(undefined8 *)(lVar13 + -8) = 10;
      lVar16 = *(long *)(lVar13 + -8);
      uVar19 = 0;
      local_50 = peVar21;
      local_48 = uVar20;
      for (; iVar18 = (int)uVar19, uVar20 != uVar17; uVar17 = uVar17 + 1) {
        peVar3 = (&local_38->type)[uVar17];
        if (peVar3 != (ecs_type_t)0x101) {
          uVar15 = uVar15 & 0xffffffff;
          if (((ulong)peVar3 & 0xffffffffffffff) == local_68 &&
              ((ulong)peVar3 & 0xff00000000000000) == 0xfd00000000000000) {
            uVar15 = uVar19;
          }
          if ((long)uVar17 < local_58) {
            peVar4 = local_60->columns;
            offset = *(short *)((long)&peVar4->data + lVar16);
            if (offset < 0x11) {
              *(undefined8 *)(lVar13 + -8) = 0x10;
              offset = (short)*(undefined8 *)(lVar13 + -8);
            }
            peVar2 = *(ecs_vector_t **)((long)peVar4 + lVar16 + -10);
            sVar1 = *(short *)((long)peVar4 + lVar16 + -2);
            *(undefined8 *)(lVar13 + -8) = 0x11196f;
            pvVar10 = _ecs_vector_first(peVar2,(int)sVar1,offset);
            *(void **)(local_88 + (long)iVar18 * 8) = pvVar10;
            uVar20 = local_48;
            peVar21 = local_50;
          }
          peVar21[iVar18] = (ecs_entity_t)peVar3;
          uVar19 = (ulong)(iVar18 + 1);
        }
        lVar16 = lVar16 + 0x10;
      }
      iVar14 = (int)uVar15;
      *(undefined8 *)(lVar13 + -8) = 0xc;
      uVar5 = *(undefined8 *)(lVar13 + -8);
      *(undefined8 *)(lVar13 + -8) = 0x1119db;
      _ecs_assert(iVar14 != -1,(int32_t)uVar5,(char *)0x0,"base_index != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x20c);
      peVar12 = local_60;
      if (iVar14 == -1) {
        *(code **)(lVar13 + -8) = set_switch;
        __assert_fail("base_index != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x20c,
                      "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                     );
      }
      if ((local_90->flags & 2) != 0) {
        peVar21[iVar18] = 0x101;
        iVar18 = iVar18 + 1;
      }
      local_a0.count = iVar18;
      peVar2 = local_40->entities;
      *(undefined8 *)(lVar13 + -8) = 8;
      uVar5 = *(undefined8 *)(lVar13 + -8);
      *(undefined8 *)(lVar13 + -8) = 0x10;
      uVar6 = *(undefined8 *)(lVar13 + -8);
      *(undefined8 *)(lVar13 + -8) = 0x111a21;
      local_50 = (ecs_entity_t *)_ecs_vector_first(peVar2,(ecs_size_t)uVar5,(int16_t)uVar6);
      peVar2 = peVar12->entities;
      *(undefined8 *)(lVar13 + -8) = 0x111a2d;
      uVar9 = ecs_vector_count(peVar2);
      local_48 = (ulong)iVar14;
      local_40 = (ecs_data_t *)CONCAT44(local_40._4_4_,uVar9);
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      local_58 = (long)(local_78 + child_row);
      for (local_68 = (ulong)child_row; peVar7 = local_70, (long)local_68 < local_58;
          local_68 = local_68 + 1) {
        uVar20 = *(ulong *)((long)local_50 + local_68 * 8);
        local_a0.array[local_48] = uVar20 | 0xfd00000000000000;
        *(undefined8 *)(lVar13 + -8) = 0x111a99;
        peVar11 = ecs_table_find_or_create(peVar7,&local_a0);
        *(undefined8 *)(lVar13 + -8) = 0xc;
        uVar5 = *(undefined8 *)(lVar13 + -8);
        row_out = (int32_t *)0x222;
        *(undefined8 *)(lVar13 + -8) = 0x111ac3;
        _ecs_assert(peVar11 != (ecs_table_t *)0x0,(int32_t)uVar5,(char *)0x0,"i_table != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x222);
        local_38 = peVar11;
        if (peVar11 == (ecs_table_t *)0x0) {
          *(undefined8 *)(lVar13 + -8) = 0x111bcf;
          __assert_fail("i_table != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x222,
                        "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                       );
        }
        peVar2 = peVar12->entities;
        *(undefined8 *)(lVar13 + -8) = 8;
        uVar5 = *(undefined8 *)(lVar13 + -8);
        *(undefined8 *)(lVar13 + -8) = 0x10;
        uVar6 = *(undefined8 *)(lVar13 + -8);
        *(undefined8 *)(lVar13 + -8) = 0x111ade;
        pvVar10 = _ecs_vector_first(peVar2,(ecs_size_t)uVar5,(int16_t)uVar6);
        uVar17 = 0;
        while (peVar11 = local_38, peVar7 = local_70, lVar16 = local_88, uVar9 != uVar17) {
          uVar15 = *(ulong *)((long)pvVar10 + uVar17 * 8);
          *(undefined8 *)(lVar13 + -8) = 2;
          uVar5 = *(undefined8 *)(lVar13 + -8);
          row_out = (int32_t *)0x22d;
          *(undefined8 *)(lVar13 + -8) = 0x111b14;
          _ecs_assert(uVar15 != uVar20,(int32_t)uVar5,(char *)0x0,"child != instance",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x22d);
          uVar17 = uVar17 + 1;
          if (uVar15 == uVar20) {
            *(undefined8 *)(lVar13 + -8) = 0x111bb0;
            __assert_fail("child != instance",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                          ,0x22d,
                          "void instantiate_children(ecs_world_t *, ecs_entity_t, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_table_t *)"
                         );
          }
        }
        component_ids = (ecs_entities_t *)((ulong)local_40 & 0xffffffff);
        *(undefined8 *)(lVar13 + -8) = 0x111b39;
        new_w_data(peVar7,peVar11,component_ids,(int32_t)lVar16,(void **)&local_7c,row_out);
        *(undefined8 *)(lVar13 + -8) = 0x111b41;
        peVar12 = ecs_table_get_data(peVar11);
        *(undefined8 *)(lVar13 + -8) = 1;
        uVar5 = *(undefined8 *)(lVar13 + -8);
        for (uVar20 = 0; peVar11 = local_38, peVar7 = local_70, uVar9 != uVar20; uVar20 = uVar20 + 1
            ) {
          base_00 = *(ecs_entity_t *)((long)pvVar10 + uVar20 * 8);
          iVar18 = local_7c + (int)uVar20;
          *(undefined8 *)(lVar13 + -8) = 0x111b6d;
          instantiate(peVar7,base_00,peVar11,peVar12,iVar18,(int32_t)uVar5);
        }
        peVar12 = local_60;
      }
    }
  }
  return;
}

Assistant:

static
void instantiate_children(
    ecs_world_t * world,
    ecs_entity_t base,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,
    ecs_table_t * child_table)
{
    ecs_type_t type = child_table->type;
    ecs_data_t *child_data = ecs_table_get_data(child_table);
    if (!child_data || !ecs_table_data_count(child_data)) {
        return;
    }

    int32_t column_count = child_table->column_count;
    ecs_entity_t *type_array = ecs_vector_first(type, ecs_entity_t);
    int32_t type_count = ecs_vector_count(type);   

    /* Instantiate child table for each instance */

    /* Create component array for creating the table */
    ecs_entities_t components = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * type_count + 1)
    };

    void **c_info = ecs_os_alloca(ECS_SIZEOF(void*) * column_count);

    /* Copy in component identifiers. Find the base index in the component
     * array, since we'll need this to replace the base with the instance id */
    int i, base_index = -1, pos = 0;

    for (i = 0; i < type_count; i ++) {
        ecs_entity_t c = type_array[i];
        
        /* Make sure instances don't have EcsPrefab */
        if (c == EcsPrefab) {
            continue;
        }

        /* Keep track of the element that creates the CHILDOF relationship with
        * the prefab parent. We need to replace this element to make sure the
        * created children point to the instance and not the prefab */ 
        if (ECS_HAS_ROLE(c, CHILDOF) && (c & ECS_COMPONENT_MASK) == base) {
            base_index = pos;
        }        

        /* Store pointer to component array. We'll use this component array to
        * create our new entities in bulk with new_w_data */
        if (i < column_count) {
            ecs_column_t *column = &child_data->columns[i];
            c_info[pos] = ecs_vector_first_t(
                column->data, column->size, column->alignment);
        }

        components.array[pos] = c;
        pos ++;
    }

    ecs_assert(base_index != -1, ECS_INTERNAL_ERROR, NULL);

    /* If children are added to a prefab, make sure they are prefabs too */
    if (table->flags & EcsTableIsPrefab) {
        components.array[pos] = EcsPrefab;
        pos ++;
    }

    components.count = pos;

    /* Instantiate the prefab child table for each new instance */
    ecs_entity_t *entities = ecs_vector_first(data->entities, ecs_entity_t);
    int32_t child_count = ecs_vector_count(child_data->entities);

    for (i = row; i < count + row; i ++) {
        ecs_entity_t instance = entities[i];

        /* Replace CHILDOF element in the component array with instance id */
        components.array[base_index] = ECS_CHILDOF | instance;

        /* Find or create table */
        ecs_table_t *i_table = ecs_table_find_or_create(world, &components);
        ecs_assert(i_table != NULL, ECS_INTERNAL_ERROR, NULL); 

        /* The instance is trying to instantiate from a base that is also
         * its parent. This would cause the hierarchy to instantiate itself
         * which would cause infinite recursion. */
        int j;
        ecs_entity_t *children = ecs_vector_first(
            child_data->entities, ecs_entity_t);
#ifndef NDEBUG
        for (j = 0; j < child_count; j ++) {
            ecs_entity_t child = children[j];        
            ecs_assert(child != instance, ECS_INVALID_PARAMETER, NULL);
        }
#endif

        /* Create children */
        int32_t child_row; 
        new_w_data(world, i_table, NULL, child_count, c_info, &child_row);       

        /* If prefab child table has children itself, recursively instantiate */
        ecs_data_t *i_data = ecs_table_get_data(i_table);
        for (j = 0; j < child_count; j ++) {
            ecs_entity_t child = children[j];
            instantiate(world, child, i_table, i_data, child_row + j, 1);
        }
    }       
}